

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_info.cpp
# Opt level: O2

void __thiscall
ObjectInfoCollection::RemoveObject
          (ObjectInfoCollection *this,uint64_t object_handle,XrObjectType object_type)

{
  const_iterator __last;
  XrSdkLogObjectInfo *pXVar1;
  long lVar2;
  const_iterator __first;
  long lVar3;
  XrSdkLogObjectInfo *pXVar4;
  XrSdkLogObjectInfo *pXVar5;
  
  pXVar4 = (this->object_info_).
           super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  __last._M_current =
       (this->object_info_).
       super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
       super__Vector_impl_data._M_finish;
  lVar3 = (long)__last._M_current - (long)pXVar4;
  for (lVar2 = lVar3 / 0x30 >> 2; 0 < lVar2; lVar2 = lVar2 + -1) {
    if ((pXVar4->handle == object_handle) &&
       (__first._M_current = pXVar4, pXVar4->type == object_type)) goto LAB_001176b4;
    if ((pXVar4[1].handle == object_handle) && (pXVar4[1].type == object_type)) {
      __first._M_current = pXVar4 + 1;
      goto LAB_001176b4;
    }
    if ((pXVar4[2].handle == object_handle) && (pXVar4[2].type == object_type)) {
      __first._M_current = pXVar4 + 2;
      goto LAB_001176b4;
    }
    if ((pXVar4[3].handle == object_handle) && (pXVar4[3].type == object_type)) {
      __first._M_current = pXVar4 + 3;
      goto LAB_001176b4;
    }
    pXVar4 = pXVar4 + 4;
    lVar3 = lVar3 + -0xc0;
  }
  lVar3 = lVar3 / 0x30;
  if (lVar3 == 1) {
LAB_0011768b:
    __first._M_current = __last._M_current;
    if (pXVar4->type == object_type) {
      __first._M_current = pXVar4;
    }
    if (pXVar4->handle != object_handle) {
      __first._M_current = __last._M_current;
    }
  }
  else if (lVar3 == 2) {
LAB_0011767d:
    if ((pXVar4->handle != object_handle) ||
       (__first._M_current = pXVar4, pXVar4->type != object_type)) {
      pXVar4 = pXVar4 + 1;
      goto LAB_0011768b;
    }
  }
  else {
    __first._M_current = __last._M_current;
    if (lVar3 != 3) goto LAB_001176f1;
    if ((pXVar4->handle != object_handle) ||
       (__first._M_current = pXVar4, pXVar4->type != object_type)) {
      pXVar4 = pXVar4 + 1;
      goto LAB_0011767d;
    }
  }
LAB_001176b4:
  pXVar4 = __first._M_current;
  if (__first._M_current != __last._M_current) {
    while (pXVar5 = pXVar4 + 1, pXVar5 != __last._M_current) {
      if ((pXVar5->handle != object_handle) ||
         (pXVar1 = pXVar4 + 1, pXVar4 = pXVar5, pXVar1->type != object_type)) {
        XrSdkLogObjectInfo::operator=(__first._M_current,pXVar5);
        __first._M_current = __first._M_current + 1;
        pXVar4 = pXVar5;
      }
    }
  }
LAB_001176f1:
  std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::erase
            (&this->object_info_,__first,__last);
  return;
}

Assistant:

void ObjectInfoCollection::RemoveObject(uint64_t object_handle, XrObjectType object_type) {
    vector_remove_if_and_erase(
        object_info_, [=](XrSdkLogObjectInfo const& info) { return info.handle == object_handle && info.type == object_type; });
}